

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

IfStatement * __thiscall
soul::PoolAllocator::
allocate<soul::AST::IfStatement,soul::AST::Context&,bool&,soul::AST::Expression&,soul::AST::Block&,soul::pool_ptr<soul::AST::Statement>&>
          (PoolAllocator *this,Context *args,bool *args_1,Expression *args_2,Block *args_3,
          pool_ptr<soul::AST::Statement> *args_4)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_5d [13];
  pool_ptr<soul::AST::Statement> local_50;
  IfStatement *local_48;
  IfStatement *newObject;
  PoolItem *newItem;
  pool_ptr<soul::AST::Statement> *args_local_4;
  Block *args_local_3;
  Expression *args_local_2;
  bool *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_4;
  args_local_4 = (pool_ptr<soul::AST::Statement> *)args_3;
  args_local_3 = (Block *)args_2;
  args_local_2 = (Expression *)args_1;
  args_local_1 = (bool *)args;
  args_local = (Context *)this;
  newObject = (IfStatement *)allocateSpaceForObject(this,0x48);
  this_00 = &(newObject->super_Statement).super_ASTObject.context;
  local_50.object = (Statement *)newItem->size;
  AST::IfStatement::IfStatement
            ((IfStatement *)this_00,(Context *)args_local_1,
             (bool)(*(byte *)&(args_local_2->super_Statement).super_ASTObject._vptr_ASTObject & 1),
             (Expression *)args_local_3,(Statement *)args_local_4,&local_50);
  pool_ptr<soul::AST::Statement>::~pool_ptr(&local_50);
  local_48 = (IfStatement *)this_00;
  pDVar1 = allocate(soul::AST::Context&,bool&,soul::AST::Expression&,soul::AST::Block&,soul::pool_ptr&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(local_5d);
  *(DestructorFn **)&(newObject->super_Statement).super_ASTObject.objectType = pDVar1;
  return local_48;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }